

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_error.hpp
# Opt level: O2

void __thiscall tao::pegtl::parse_error::parse_error(parse_error *this,string *msg,position *pos)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  to_string_abi_cxx11_(&local_40,(pegtl *)pos,pos);
  std::operator+(&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,": "
                );
  std::operator+(&local_80,&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)msg);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__parse_error_002078f8;
  std::vector<tao::pegtl::position,_std::allocator<tao::pegtl::position>_>::vector
            (&this->positions,1,pos,(allocator_type *)&local_80);
  return;
}

Assistant:

parse_error( const std::string& msg, const position& pos )
            : std::runtime_error( to_string( pos ) + ": " + msg ),
              positions( 1, pos )
         {
         }